

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O3

string * __thiscall
pbrt::HGPhaseFunction::ToString_abi_cxx11_(string *__return_storage_ptr__,HGPhaseFunction *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<float_const&>
            (__return_storage_ptr__,"[ HGPhaseFunction g: %f ]",&this->g);
  return __return_storage_ptr__;
}

Assistant:

std::string HGPhaseFunction::ToString() const {
    return StringPrintf("[ HGPhaseFunction g: %f ]", g);
}